

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O0

_Bool start_game(_Bool new_game)

{
  _Bool _Var1;
  _Bool local_1b;
  _Bool newer;
  char *pcStack_18;
  _Bool exists;
  char *loadpath;
  _Bool new_game_local;
  
  pcStack_18 = savefile;
  player->is_dead = true;
  savefile_get_panic_name(panicfile,0x400,savefile);
  safe_setuid_grab();
  local_1b = false;
  if (savefile[0] != '\0') {
    local_1b = file_exists(panicfile);
  }
  safe_setuid_drop();
  if (local_1b != false) {
    safe_setuid_grab();
    _Var1 = file_newer(panicfile,savefile);
    safe_setuid_drop();
    if (_Var1) {
      _Var1 = get_check("A panic save exists.  Use it? ");
      if (_Var1) {
        pcStack_18 = panicfile;
      }
    }
    else {
      safe_setuid_grab();
      file_delete(panicfile);
      safe_setuid_drop();
    }
  }
  safe_setuid_grab();
  _Var1 = file_exists(pcStack_18);
  safe_setuid_drop();
  if ((!_Var1) || (_Var1 = savefile_load(pcStack_18,(_Bool)(arg_wizard & 1)), _Var1)) {
    if (((player->is_dead & 1U) != 0) || (new_game)) {
      character_generated = false;
      textui_do_birth();
    }
    else {
      update_player_object_knowledge(player);
    }
    event_signal(EVENT_LEAVE_INIT);
    event_signal(EVENT_ENTER_GAME);
    event_signal(EVENT_ENTER_WORLD);
    player->upkeep->autosave = false;
    if ((character_dungeon & 1U) == 0) {
      prepare_next_level(player);
    }
    on_new_level();
    loadpath._7_1_ = true;
  }
  else {
    loadpath._7_1_ = false;
  }
  return loadpath._7_1_;
}

Assistant:

static bool start_game(bool new_game)
{
	const char *loadpath = savefile;
	bool exists;

	/* Player will be resuscitated if living in the savefile */
	player->is_dead = true;

	/* Try loading */
	savefile_get_panic_name(panicfile, sizeof(panicfile), loadpath);
	safe_setuid_grab();
	exists = loadpath[0] && file_exists(panicfile);
	safe_setuid_drop();
	if (exists) {
		bool newer;

		safe_setuid_grab();
		newer = file_newer(panicfile, loadpath);
		safe_setuid_drop();
		if (newer) {
			if (get_check("A panic save exists.  Use it? ")) {
				loadpath = panicfile;
			}
		} else {
			/* Remove the out-of-date panic save. */
			safe_setuid_grab();
			file_delete(panicfile);
			safe_setuid_drop();
		}
	}
	safe_setuid_grab();
	exists = file_exists(loadpath);
	safe_setuid_drop();
	if (exists && !savefile_load(loadpath, arg_wizard)) {
		return false;
	}

	/* No living character loaded */
	if (player->is_dead || new_game) {
		character_generated = false;
		textui_do_birth();
	} else {
		/*
		 * Bring the stock curse objects up-to-date with what the
		 * player knows.
		 */
		update_player_object_knowledge(player);
	}

	/* Tell the UI we've started. */
	event_signal(EVENT_LEAVE_INIT);
	event_signal(EVENT_ENTER_GAME);
	event_signal(EVENT_ENTER_WORLD);

	/* Save not required yet. */
	player->upkeep->autosave = false;

	/* Enter the level, generating a new one if needed */
	if (!character_dungeon) {
		prepare_next_level(player);
	}
	on_new_level();

	return true;
}